

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fRasterizationTests.cpp
# Opt level: O2

int __thiscall
deqp::gles2::Functional::RasterizationTests::init(RasterizationTests *this,EVP_PKEY_CTX *ctx)

{
  GLenum GVar1;
  GLenum GVar2;
  undefined4 uVar3;
  int extraout_EAX;
  TestNode *pTVar4;
  BaseTriangleCase *pBVar5;
  TestNode *pTVar6;
  BaseRenderingCase *pBVar7;
  FillRuleCase *pFVar8;
  long lVar9;
  long lVar10;
  TriangleInterpolationTest *pTVar11;
  LineInterpolationTest *pLVar12;
  FillRuleCaseType type;
  allocator<char> local_c9;
  long local_c8;
  PrimitiveType *local_c0;
  long local_b8;
  long local_b0;
  TestNode *local_a8;
  CullMode *local_a0;
  char *local_98;
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pTVar4 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"primitives",
             "Primitive rasterization");
  tcu::TestNode::addChild((TestNode *)this,pTVar4);
  pBVar5 = (BaseTriangleCase *)operator_new(0xa8);
  anon_unknown_1::BaseTriangleCase::BaseTriangleCase
            (pBVar5,(this->super_TestCaseGroup).m_context,"triangles",
             "Render primitives as GL_TRIANGLES, verify rasterization result",4);
  (pBVar5->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__BaseRenderingCase_01e14c48;
  tcu::TestNode::addChild(pTVar4,(TestNode *)pBVar5);
  pBVar5 = (BaseTriangleCase *)operator_new(0xa8);
  anon_unknown_1::BaseTriangleCase::BaseTriangleCase
            (pBVar5,(this->super_TestCaseGroup).m_context,"triangle_strip",
             "Render primitives as GL_TRIANGLE_STRIP, verify rasterization result",5);
  (pBVar5->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__BaseRenderingCase_01e14d48;
  tcu::TestNode::addChild(pTVar4,(TestNode *)pBVar5);
  pBVar5 = (BaseTriangleCase *)operator_new(0xa8);
  anon_unknown_1::BaseTriangleCase::BaseTriangleCase
            (pBVar5,(this->super_TestCaseGroup).m_context,"triangle_fan",
             "Render primitives as GL_TRIANGLE_FAN, verify rasterization result",6);
  (pBVar5->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__BaseRenderingCase_01e14da0;
  tcu::TestNode::addChild(pTVar4,(TestNode *)pBVar5);
  pTVar6 = (TestNode *)operator_new(0xb0);
  anon_unknown_1::LinesCase::LinesCase
            ((LinesCase *)pTVar6,(this->super_TestCaseGroup).m_context,"lines",
             "Render primitives as GL_LINES, verify rasterization result",PRIMITIVEWIDENESS_NARROW);
  tcu::TestNode::addChild(pTVar4,pTVar6);
  pTVar6 = (TestNode *)operator_new(0xb0);
  anon_unknown_1::LineStripCase::LineStripCase
            ((LineStripCase *)pTVar6,(this->super_TestCaseGroup).m_context,"line_strip",
             "Render primitives as GL_LINE_STRIP, verify rasterization result",
             PRIMITIVEWIDENESS_NARROW);
  tcu::TestNode::addChild(pTVar4,pTVar6);
  pTVar6 = (TestNode *)operator_new(0xb0);
  anon_unknown_1::LineLoopCase::LineLoopCase
            ((LineLoopCase *)pTVar6,(this->super_TestCaseGroup).m_context,"line_loop",
             "Render primitives as GL_LINE_LOOP, verify rasterization result",
             PRIMITIVEWIDENESS_NARROW);
  tcu::TestNode::addChild(pTVar4,pTVar6);
  pTVar6 = (TestNode *)operator_new(0xb0);
  anon_unknown_1::LinesCase::LinesCase
            ((LinesCase *)pTVar6,(this->super_TestCaseGroup).m_context,"lines_wide",
             "Render primitives as GL_LINES with wide lines, verify rasterization result",
             PRIMITIVEWIDENESS_WIDE);
  tcu::TestNode::addChild(pTVar4,pTVar6);
  pTVar6 = (TestNode *)operator_new(0xb0);
  anon_unknown_1::LineStripCase::LineStripCase
            ((LineStripCase *)pTVar6,(this->super_TestCaseGroup).m_context,"line_strip_wide",
             "Render primitives as GL_LINE_STRIP with wide lines, verify rasterization result",
             PRIMITIVEWIDENESS_WIDE);
  tcu::TestNode::addChild(pTVar4,pTVar6);
  pTVar6 = (TestNode *)operator_new(0xb0);
  anon_unknown_1::LineLoopCase::LineLoopCase
            ((LineLoopCase *)pTVar6,(this->super_TestCaseGroup).m_context,"line_loop_wide",
             "Render primitives as GL_LINE_LOOP with wide lines, verify rasterization result",
             PRIMITIVEWIDENESS_WIDE);
  tcu::TestNode::addChild(pTVar4,pTVar6);
  pBVar7 = (BaseRenderingCase *)operator_new(0xa8);
  type = 0x100;
  anon_unknown_1::BaseRenderingCase::BaseRenderingCase
            (pBVar7,(this->super_TestCaseGroup).m_context,"points",
             "Render primitives as GL_POINTS, verify rasterization result",0x100);
  (pBVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__BaseRenderingCase_01e14f58;
  pBVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)0x300000000;
  *(undefined4 *)&pBVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = 1;
  *(undefined1 *)((long)&pBVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx + 4) = 1;
  pBVar7->m_pointSize = 10.0;
  tcu::TestNode::addChild(pTVar4,(TestNode *)pBVar7);
  pTVar4 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"fill_rules",
             "Primitive fill rules");
  tcu::TestNode::addChild((TestNode *)this,pTVar4);
  pFVar8 = (FillRuleCase *)operator_new(0xa8);
  anon_unknown_1::FillRuleCase::FillRuleCase
            (pFVar8,(this->super_TestCaseGroup).m_context,"basic_quad",(char *)0x0,type);
  tcu::TestNode::addChild(pTVar4,(TestNode *)pFVar8);
  pFVar8 = (FillRuleCase *)operator_new(0xa8);
  anon_unknown_1::FillRuleCase::FillRuleCase
            (pFVar8,(this->super_TestCaseGroup).m_context,"basic_quad_reverse",&DAT_00000001,type);
  tcu::TestNode::addChild(pTVar4,(TestNode *)pFVar8);
  pFVar8 = (FillRuleCase *)operator_new(0xa8);
  anon_unknown_1::FillRuleCase::FillRuleCase
            (pFVar8,(this->super_TestCaseGroup).m_context,"clipped_full",(char *)0x2,type);
  tcu::TestNode::addChild(pTVar4,(TestNode *)pFVar8);
  pFVar8 = (FillRuleCase *)operator_new(0xa8);
  anon_unknown_1::FillRuleCase::FillRuleCase
            (pFVar8,(this->super_TestCaseGroup).m_context,"clipped_partly",(char *)0x3,type);
  tcu::TestNode::addChild(pTVar4,(TestNode *)pFVar8);
  pFVar8 = (FillRuleCase *)operator_new(0xa8);
  anon_unknown_1::FillRuleCase::FillRuleCase
            (pFVar8,(this->super_TestCaseGroup).m_context,"projected",&DAT_00000004,type);
  tcu::TestNode::addChild(pTVar4,(TestNode *)pFVar8);
  pTVar4 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"culling",
             "Culling");
  tcu::TestNode::addChild((TestNode *)this,pTVar4);
  lVar10 = 0;
  local_a8 = (TestNode *)this;
  while (lVar10 != 3) {
    local_a0 = init::cullModes + lVar10;
    local_98 = init::cullModes[lVar10].prefix;
    lVar9 = 0;
    local_b8 = lVar10;
    while (lVar9 != 3) {
      local_c0 = init::primitiveTypes + lVar9;
      local_c8 = 0;
      local_b0 = lVar9;
      while( true ) {
        if (local_c8 == 0x20) break;
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,local_98,&local_c9);
        std::operator+(&local_50,&local_70,local_c0->name);
        std::operator+(&name,&local_50,*(char **)((long)&init::frontOrders[0].postfix + local_c8));
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_70);
        pBVar7 = (BaseRenderingCase *)operator_new(0xa8);
        GVar1 = local_a0->mode;
        GVar2 = local_c0->type;
        uVar3 = *(undefined4 *)((long)&init::frontOrders[0].mode + local_c8);
        anon_unknown_1::BaseRenderingCase::BaseRenderingCase
                  (pBVar7,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,
                   name._M_dataplus._M_p,"Test primitive culling.",0x100);
        (pBVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
             (_func_int **)&PTR__BaseRenderingCase_01e14ff8;
        *(GLenum *)&pBVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = GVar1;
        *(GLenum *)
         ((long)&pBVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4) = GVar2;
        *(undefined4 *)&pBVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = uVar3;
        tcu::TestNode::addChild(pTVar4,(TestNode *)pBVar7);
        this = (RasterizationTests *)local_a8;
        std::__cxx11::string::~string((string *)&name);
        local_c8 = local_c8 + 0x10;
      }
      local_c8 = 0x20;
      lVar9 = local_b0 + 1;
    }
    lVar10 = local_b8 + 1;
  }
  pTVar4 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,((TestNode *)this)->m_testCtx,"interpolation",
             "Test interpolation");
  tcu::TestNode::addChild((TestNode *)this,pTVar4);
  pTVar6 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,((TestNode *)this)->m_testCtx,"basic",
             "Non-projective interpolation");
  tcu::TestNode::addChild(pTVar4,pTVar6);
  pTVar11 = (TriangleInterpolationTest *)operator_new(0xb0);
  anon_unknown_1::TriangleInterpolationTest::TriangleInterpolationTest
            (pTVar11,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"triangles",
             "Verify triangle interpolation",4,0);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pTVar11);
  pTVar11 = (TriangleInterpolationTest *)operator_new(0xb0);
  anon_unknown_1::TriangleInterpolationTest::TriangleInterpolationTest
            (pTVar11,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"triangle_strip",
             "Verify triangle strip interpolation",5,0);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pTVar11);
  pTVar11 = (TriangleInterpolationTest *)operator_new(0xb0);
  anon_unknown_1::TriangleInterpolationTest::TriangleInterpolationTest
            (pTVar11,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"triangle_fan",
             "Verify triangle fan interpolation",6,0);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pTVar11);
  pLVar12 = (LineInterpolationTest *)operator_new(0xf8);
  anon_unknown_1::LineInterpolationTest::LineInterpolationTest
            (pLVar12,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"lines",
             "Verify line interpolation",1,0,1.0);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pLVar12);
  pLVar12 = (LineInterpolationTest *)operator_new(0xf8);
  anon_unknown_1::LineInterpolationTest::LineInterpolationTest
            (pLVar12,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"line_strip",
             "Verify line strip interpolation",3,0,1.0);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pLVar12);
  pLVar12 = (LineInterpolationTest *)operator_new(0xf8);
  anon_unknown_1::LineInterpolationTest::LineInterpolationTest
            (pLVar12,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"line_loop",
             "Verify line loop interpolation",2,0,1.0);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pLVar12);
  pLVar12 = (LineInterpolationTest *)operator_new(0xf8);
  anon_unknown_1::LineInterpolationTest::LineInterpolationTest
            (pLVar12,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"lines_wide",
             "Verify wide line interpolation",1,0,5.0);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pLVar12);
  pLVar12 = (LineInterpolationTest *)operator_new(0xf8);
  anon_unknown_1::LineInterpolationTest::LineInterpolationTest
            (pLVar12,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"line_strip_wide",
             "Verify wide line strip interpolation",3,0,5.0);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pLVar12);
  pLVar12 = (LineInterpolationTest *)operator_new(0xf8);
  anon_unknown_1::LineInterpolationTest::LineInterpolationTest
            (pLVar12,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"line_loop_wide",
             "Verify wide line loop interpolation",2,0,5.0);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pLVar12);
  pTVar6 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,((TestNode *)this)->m_testCtx,"projected",
             "Projective interpolation");
  tcu::TestNode::addChild(pTVar4,pTVar6);
  pTVar11 = (TriangleInterpolationTest *)operator_new(0xb0);
  anon_unknown_1::TriangleInterpolationTest::TriangleInterpolationTest
            (pTVar11,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"triangles",
             "Verify triangle interpolation",4,2);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pTVar11);
  pTVar11 = (TriangleInterpolationTest *)operator_new(0xb0);
  anon_unknown_1::TriangleInterpolationTest::TriangleInterpolationTest
            (pTVar11,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"triangle_strip",
             "Verify triangle strip interpolation",5,2);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pTVar11);
  pTVar11 = (TriangleInterpolationTest *)operator_new(0xb0);
  anon_unknown_1::TriangleInterpolationTest::TriangleInterpolationTest
            (pTVar11,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"triangle_fan",
             "Verify triangle fan interpolation",6,2);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pTVar11);
  pLVar12 = (LineInterpolationTest *)operator_new(0xf8);
  anon_unknown_1::LineInterpolationTest::LineInterpolationTest
            (pLVar12,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"lines",
             "Verify line interpolation",1,2,1.0);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pLVar12);
  pLVar12 = (LineInterpolationTest *)operator_new(0xf8);
  anon_unknown_1::LineInterpolationTest::LineInterpolationTest
            (pLVar12,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"line_strip",
             "Verify line strip interpolation",3,2,1.0);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pLVar12);
  pLVar12 = (LineInterpolationTest *)operator_new(0xf8);
  anon_unknown_1::LineInterpolationTest::LineInterpolationTest
            (pLVar12,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"line_loop",
             "Verify line loop interpolation",2,2,1.0);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pLVar12);
  pLVar12 = (LineInterpolationTest *)operator_new(0xf8);
  anon_unknown_1::LineInterpolationTest::LineInterpolationTest
            (pLVar12,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"lines_wide",
             "Verify wide line interpolation",1,2,5.0);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pLVar12);
  pLVar12 = (LineInterpolationTest *)operator_new(0xf8);
  anon_unknown_1::LineInterpolationTest::LineInterpolationTest
            (pLVar12,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"line_strip_wide",
             "Verify wide line strip interpolation",3,2,5.0);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pLVar12);
  pLVar12 = (LineInterpolationTest *)operator_new(0xf8);
  anon_unknown_1::LineInterpolationTest::LineInterpolationTest
            (pLVar12,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"line_loop_wide",
             "Verify wide line loop interpolation",2,2,5.0);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pLVar12);
  return extraout_EAX;
}

Assistant:

void RasterizationTests::init (void)
{
	// .primitives
	{
		tcu::TestCaseGroup* const primitives = new tcu::TestCaseGroup(m_testCtx, "primitives", "Primitive rasterization");

		addChild(primitives);

		primitives->addChild(new TrianglesCase		(m_context, "triangles",		"Render primitives as GL_TRIANGLES, verify rasterization result"));
		primitives->addChild(new TriangleStripCase	(m_context, "triangle_strip",	"Render primitives as GL_TRIANGLE_STRIP, verify rasterization result"));
		primitives->addChild(new TriangleFanCase	(m_context, "triangle_fan",		"Render primitives as GL_TRIANGLE_FAN, verify rasterization result"));
		primitives->addChild(new LinesCase			(m_context, "lines",			"Render primitives as GL_LINES, verify rasterization result",							PRIMITIVEWIDENESS_NARROW));
		primitives->addChild(new LineStripCase		(m_context, "line_strip",		"Render primitives as GL_LINE_STRIP, verify rasterization result",						PRIMITIVEWIDENESS_NARROW));
		primitives->addChild(new LineLoopCase		(m_context, "line_loop",		"Render primitives as GL_LINE_LOOP, verify rasterization result",						PRIMITIVEWIDENESS_NARROW));
		primitives->addChild(new LinesCase			(m_context, "lines_wide",		"Render primitives as GL_LINES with wide lines, verify rasterization result",			PRIMITIVEWIDENESS_WIDE));
		primitives->addChild(new LineStripCase		(m_context, "line_strip_wide",	"Render primitives as GL_LINE_STRIP with wide lines, verify rasterization result",		PRIMITIVEWIDENESS_WIDE));
		primitives->addChild(new LineLoopCase		(m_context, "line_loop_wide",	"Render primitives as GL_LINE_LOOP with wide lines, verify rasterization result",		PRIMITIVEWIDENESS_WIDE));
		primitives->addChild(new PointCase			(m_context, "points",			"Render primitives as GL_POINTS, verify rasterization result",							PRIMITIVEWIDENESS_WIDE));
	}

	// .fill_rules
	{
		tcu::TestCaseGroup* const fillRules = new tcu::TestCaseGroup(m_testCtx, "fill_rules", "Primitive fill rules");

		addChild(fillRules);

		fillRules->addChild(new FillRuleCase(m_context,	"basic_quad",			"Verify fill rules",	FillRuleCase::FILLRULECASE_BASIC));
		fillRules->addChild(new FillRuleCase(m_context,	"basic_quad_reverse",	"Verify fill rules",	FillRuleCase::FILLRULECASE_REVERSED));
		fillRules->addChild(new FillRuleCase(m_context,	"clipped_full",			"Verify fill rules",	FillRuleCase::FILLRULECASE_CLIPPED_FULL));
		fillRules->addChild(new FillRuleCase(m_context,	"clipped_partly",		"Verify fill rules",	FillRuleCase::FILLRULECASE_CLIPPED_PARTIAL));
		fillRules->addChild(new FillRuleCase(m_context,	"projected",			"Verify fill rules",	FillRuleCase::FILLRULECASE_PROJECTED));
	}

	// .culling
	{
		static const struct CullMode
		{
			glw::GLenum	mode;
			const char*	prefix;
		} cullModes[] =
		{
			{ GL_FRONT,				"front_"	},
			{ GL_BACK,				"back_"		},
			{ GL_FRONT_AND_BACK,	"both_"		},
		};
		static const struct PrimitiveType
		{
			glw::GLenum	type;
			const char*	name;
		} primitiveTypes[] =
		{
			{ GL_TRIANGLES,			"triangles"			},
			{ GL_TRIANGLE_STRIP,	"triangle_strip"	},
			{ GL_TRIANGLE_FAN,		"triangle_fan"		},
		};
		static const struct FrontFaceOrder
		{
			glw::GLenum	mode;
			const char*	postfix;
		} frontOrders[] =
		{
			{ GL_CCW,	""			},
			{ GL_CW,	"_reverse"	},
		};

		tcu::TestCaseGroup* const culling = new tcu::TestCaseGroup(m_testCtx, "culling", "Culling");

		addChild(culling);

		for (int cullModeNdx   = 0; cullModeNdx   < DE_LENGTH_OF_ARRAY(cullModes);      ++cullModeNdx)
		for (int primitiveNdx  = 0; primitiveNdx  < DE_LENGTH_OF_ARRAY(primitiveTypes); ++primitiveNdx)
		for (int frontOrderNdx = 0; frontOrderNdx < DE_LENGTH_OF_ARRAY(frontOrders);    ++frontOrderNdx)
		{
			const std::string name = std::string(cullModes[cullModeNdx].prefix) + primitiveTypes[primitiveNdx].name + frontOrders[frontOrderNdx].postfix;

			culling->addChild(new CullingTest(m_context, name.c_str(), "Test primitive culling.", cullModes[cullModeNdx].mode, primitiveTypes[primitiveNdx].type, frontOrders[frontOrderNdx].mode));
		}
	}

	// .interpolation
	{
		tcu::TestCaseGroup* const interpolation = new tcu::TestCaseGroup(m_testCtx, "interpolation", "Test interpolation");

		addChild(interpolation);

		// .basic
		{
			tcu::TestCaseGroup* const basic = new tcu::TestCaseGroup(m_testCtx, "basic", "Non-projective interpolation");

			interpolation->addChild(basic);

			basic->addChild(new TriangleInterpolationTest		(m_context, "triangles",		"Verify triangle interpolation",		GL_TRIANGLES,		INTERPOLATIONFLAGS_NONE));
			basic->addChild(new TriangleInterpolationTest		(m_context, "triangle_strip",	"Verify triangle strip interpolation",	GL_TRIANGLE_STRIP,	INTERPOLATIONFLAGS_NONE));
			basic->addChild(new TriangleInterpolationTest		(m_context, "triangle_fan",		"Verify triangle fan interpolation",	GL_TRIANGLE_FAN,	INTERPOLATIONFLAGS_NONE));
			basic->addChild(new LineInterpolationTest			(m_context, "lines",			"Verify line interpolation",			GL_LINES,			INTERPOLATIONFLAGS_NONE,	1.0f));
			basic->addChild(new LineInterpolationTest			(m_context, "line_strip",		"Verify line strip interpolation",		GL_LINE_STRIP,		INTERPOLATIONFLAGS_NONE,	1.0f));
			basic->addChild(new LineInterpolationTest			(m_context, "line_loop",		"Verify line loop interpolation",		GL_LINE_LOOP,		INTERPOLATIONFLAGS_NONE,	1.0f));
			basic->addChild(new LineInterpolationTest			(m_context, "lines_wide",		"Verify wide line interpolation",		GL_LINES,			INTERPOLATIONFLAGS_NONE,	5.0f));
			basic->addChild(new LineInterpolationTest			(m_context, "line_strip_wide",	"Verify wide line strip interpolation",	GL_LINE_STRIP,		INTERPOLATIONFLAGS_NONE,	5.0f));
			basic->addChild(new LineInterpolationTest			(m_context, "line_loop_wide",	"Verify wide line loop interpolation",	GL_LINE_LOOP,		INTERPOLATIONFLAGS_NONE,	5.0f));
		}

		// .projected
		{
			tcu::TestCaseGroup* const projected = new tcu::TestCaseGroup(m_testCtx, "projected", "Projective interpolation");

			interpolation->addChild(projected);

			projected->addChild(new TriangleInterpolationTest	(m_context, "triangles",		"Verify triangle interpolation",		GL_TRIANGLES,		INTERPOLATIONFLAGS_PROJECTED));
			projected->addChild(new TriangleInterpolationTest	(m_context, "triangle_strip",	"Verify triangle strip interpolation",	GL_TRIANGLE_STRIP,	INTERPOLATIONFLAGS_PROJECTED));
			projected->addChild(new TriangleInterpolationTest	(m_context, "triangle_fan",		"Verify triangle fan interpolation",	GL_TRIANGLE_FAN,	INTERPOLATIONFLAGS_PROJECTED));
			projected->addChild(new LineInterpolationTest		(m_context, "lines",			"Verify line interpolation",			GL_LINES,			INTERPOLATIONFLAGS_PROJECTED,	1.0f));
			projected->addChild(new LineInterpolationTest		(m_context, "line_strip",		"Verify line strip interpolation",		GL_LINE_STRIP,		INTERPOLATIONFLAGS_PROJECTED,	1.0f));
			projected->addChild(new LineInterpolationTest		(m_context, "line_loop",		"Verify line loop interpolation",		GL_LINE_LOOP,		INTERPOLATIONFLAGS_PROJECTED,	1.0f));
			projected->addChild(new LineInterpolationTest		(m_context, "lines_wide",		"Verify wide line interpolation",		GL_LINES,			INTERPOLATIONFLAGS_PROJECTED,	5.0f));
			projected->addChild(new LineInterpolationTest		(m_context, "line_strip_wide",	"Verify wide line strip interpolation",	GL_LINE_STRIP,		INTERPOLATIONFLAGS_PROJECTED,	5.0f));
			projected->addChild(new LineInterpolationTest		(m_context, "line_loop_wide",	"Verify wide line loop interpolation",	GL_LINE_LOOP,		INTERPOLATIONFLAGS_PROJECTED,	5.0f));
		}
	}
}